

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O2

void __thiscall lts2::LBDOperator::drawSelfInImage(LBDOperator *this,Mat *destImage,int normalize)

{
  _InputArray *p_Var1;
  uint idx;
  _OutputArray local_210;
  Size local_1f8;
  Mat currentBasisVector;
  _InputArray local_190 [14];
  
  local_1f8 = this->_patchSize;
  cv::Mat::create(destImage,&local_1f8,5);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_190,0.0);
  _currentBasisVector = -0x3efdfffa;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)destImage,(_InputArray *)&currentBasisVector);
  cv::Mat::Mat(&currentBasisVector);
  for (idx = 0; idx < *(uint *)&(this->super_LinearOperator).field_0xc; idx = idx + 1) {
    fillBasisFunctionForIndex(this,&currentBasisVector,idx);
    cv::abs((Mat *)local_190);
    (**(code **)(*(long *)CONCAT44(local_190[0]._4_4_,local_190[0].flags) + 0x18))
              ((long *)CONCAT44(local_190[0]._4_4_,local_190[0].flags),local_190,
               (_InputArray *)&currentBasisVector,0xffffffffffffffff);
    cv::MatExpr::~MatExpr((MatExpr *)local_190);
    if (normalize < 1) {
      if (normalize < 0) {
        local_190[0].sz.width = 0;
        local_190[0].sz.height = 0;
        local_210.super__InputArray.sz.width = 0;
        local_210.super__InputArray.sz.height = 0;
        local_190[0].flags = 0x1010000;
        local_210.super__InputArray.flags = 0x3010000;
        local_210.super__InputArray.obj = (_InputArray *)&currentBasisVector;
        local_190[0].obj = (_InputArray *)&currentBasisVector;
        p_Var1 = (_InputArray *)cv::noArray();
        cv::normalize(local_190,(_InputOutputArray *)&local_210,0.0,1.0,0x20,-1,p_Var1);
      }
    }
    else {
      local_190[0].sz.width = 0;
      local_190[0].sz.height = 0;
      local_210.super__InputArray.sz.width = 0;
      local_210.super__InputArray.sz.height = 0;
      local_190[0].flags = 0x1010000;
      local_210.super__InputArray.flags = 0x2010000;
      local_210.super__InputArray.obj = (_InputArray *)&currentBasisVector;
      local_190[0].obj = (_InputArray *)&currentBasisVector;
      cv::threshold(local_190,&local_210,0.0,1.0,0);
    }
    cv::operator+=(destImage,&currentBasisVector);
  }
  cv::Mat::~Mat(&currentBasisVector);
  return;
}

Assistant:

void lts2::LBDOperator::drawSelfInImage(cv::Mat &destImage, int normalize) const
{
  destImage.create(_patchSize, CV_32FC1);
  destImage.setTo(cv::Scalar(0));

  cv::Mat currentBasisVector;
  for (int i = 0; i < _pairsInUse; ++i)
  {
    this->fillBasisFunctionForIndex(currentBasisVector, i);
    currentBasisVector = cv::abs(currentBasisVector);

    if (normalize > 0) cv::threshold(currentBasisVector, currentBasisVector, 0.0, 1.0, cv::THRESH_BINARY);
    if (normalize < 0) cv::normalize(currentBasisVector, currentBasisVector, 0.0, 1.0, cv::NORM_MINMAX);

    destImage += currentBasisVector;
  }
}